

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlNotationPtr
xmlAddNotationDecl(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *name,xmlChar *PublicID,
                  xmlChar *SystemID)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlValidityWarningFunc p_Var3;
  xmlValidityErrorFunc p_Var4;
  xmlDictPtr local_50;
  xmlDictPtr dict;
  xmlNotationTablePtr table;
  xmlNotationPtr ret;
  xmlChar *SystemID_local;
  xmlChar *PublicID_local;
  xmlChar *name_local;
  xmlDtdPtr dtd_local;
  xmlValidCtxtPtr ctxt_local;
  
  if (dtd == (xmlDtdPtr)0x0) {
    ctxt_local = (xmlValidCtxtPtr)0x0;
  }
  else if (name == (xmlChar *)0x0) {
    ctxt_local = (xmlValidCtxtPtr)0x0;
  }
  else if ((PublicID == (xmlChar *)0x0) && (SystemID == (xmlChar *)0x0)) {
    ctxt_local = (xmlValidCtxtPtr)0x0;
  }
  else {
    dict = (xmlDictPtr)dtd->notations;
    if (dict == (xmlDictPtr)0x0) {
      local_50 = (xmlDictPtr)0x0;
      if (dtd->doc != (_xmlDoc *)0x0) {
        local_50 = dtd->doc->dict;
      }
      dict = (xmlDictPtr)xmlHashCreateDict(0,local_50);
      dtd->notations = dict;
    }
    if (dict == (xmlDictPtr)0x0) {
      xmlVErrMemory(ctxt,"xmlAddNotationDecl: Table creation failed!\n");
      ctxt_local = (xmlValidCtxtPtr)0x0;
    }
    else {
      ctxt_local = (xmlValidCtxtPtr)(*xmlMalloc)(0x18);
      if (ctxt_local == (xmlValidCtxtPtr)0x0) {
        xmlVErrMemory(ctxt,"malloc failed");
        ctxt_local = (xmlValidCtxtPtr)0x0;
      }
      else {
        memset(ctxt_local,0,0x18);
        pxVar2 = xmlStrdup(name);
        ctxt_local->userData = pxVar2;
        if (SystemID != (xmlChar *)0x0) {
          p_Var3 = (xmlValidityWarningFunc)xmlStrdup(SystemID);
          ctxt_local->warning = p_Var3;
        }
        if (PublicID != (xmlChar *)0x0) {
          p_Var4 = (xmlValidityErrorFunc)xmlStrdup(PublicID);
          ctxt_local->error = p_Var4;
        }
        iVar1 = xmlHashAddEntry((xmlHashTablePtr)dict,name,ctxt_local);
        if (iVar1 != 0) {
          xmlErrValid((xmlValidCtxtPtr)0x0,XML_DTD_NOTATION_REDEFINED,
                      "xmlAddNotationDecl: %s already defined\n",(char *)name);
          xmlFreeNotation((xmlNotationPtr)ctxt_local);
          ctxt_local = (xmlValidCtxtPtr)0x0;
        }
      }
    }
  }
  return (xmlNotationPtr)ctxt_local;
}

Assistant:

xmlNotationPtr
xmlAddNotationDecl(xmlValidCtxtPtr ctxt, xmlDtdPtr dtd,
	           const xmlChar *name,
                   const xmlChar *PublicID, const xmlChar *SystemID) {
    xmlNotationPtr ret;
    xmlNotationTablePtr table;

    if (dtd == NULL) {
	return(NULL);
    }
    if (name == NULL) {
	return(NULL);
    }
    if ((PublicID == NULL) && (SystemID == NULL)) {
	return(NULL);
    }

    /*
     * Create the Notation table if needed.
     */
    table = (xmlNotationTablePtr) dtd->notations;
    if (table == NULL) {
	xmlDictPtr dict = NULL;
	if (dtd->doc != NULL)
	    dict = dtd->doc->dict;

        dtd->notations = table = xmlHashCreateDict(0, dict);
    }
    if (table == NULL) {
	xmlVErrMemory(ctxt,
		"xmlAddNotationDecl: Table creation failed!\n");
        return(NULL);
    }

    ret = (xmlNotationPtr) xmlMalloc(sizeof(xmlNotation));
    if (ret == NULL) {
	xmlVErrMemory(ctxt, "malloc failed");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlNotation));

    /*
     * fill the structure.
     */
    ret->name = xmlStrdup(name);
    if (SystemID != NULL)
        ret->SystemID = xmlStrdup(SystemID);
    if (PublicID != NULL)
        ret->PublicID = xmlStrdup(PublicID);

    /*
     * Validity Check:
     * Check the DTD for previous declarations of the ATTLIST
     */
    if (xmlHashAddEntry(table, name, ret)) {
#ifdef LIBXML_VALID_ENABLED
	xmlErrValid(NULL, XML_DTD_NOTATION_REDEFINED,
		    "xmlAddNotationDecl: %s already defined\n",
		    (const char *) name);
#endif /* LIBXML_VALID_ENABLED */
	xmlFreeNotation(ret);
	return(NULL);
    }
    return(ret);
}